

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O2

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::addUser(SubgraphNode<dg::pta::PSNode> *this,PSNode *nd)

{
  PSNode *pPVar1;
  pointer ppPVar2;
  PSNode *local_8;
  
  ppPVar2 = (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppPVar2 ==
        (this->users).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_8 = nd;
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                (&this->users,&local_8);
      return;
    }
    pPVar1 = *ppPVar2;
    ppPVar2 = ppPVar2 + 1;
  } while (pPVar1 != nd);
  return;
}

Assistant:

void addUser(NodeT *nd) {
        // do not add duplicate users
        for (auto *u : users)
            if (u == nd)
                return;

        users.push_back(nd);
    }